

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wol.cc
# Opt level: O0

void __thiscall rcdiscover::WOL::WOL(WOL *this,uint64_t hardware_addr,uint16_t port)

{
  array<unsigned_char,_6UL> aVar1;
  uint16_t in_DX;
  uint64_t in_RSI;
  WOL *in_RDI;
  
  aVar1 = toByteArray<(unsigned_char)6>(in_RDI,in_RSI);
  *(int *)(in_RDI->hardware_addr_)._M_elems = aVar1._M_elems._0_4_;
  *(short *)((in_RDI->hardware_addr_)._M_elems + 4) = aVar1._M_elems._4_2_;
  in_RDI->port_ = in_DX;
  return;
}

Assistant:

WOL::WOL(uint64_t hardware_addr, uint16_t port) noexcept :
  hardware_addr_(toByteArray<6>(std::move(hardware_addr))),
  port_{port}
{ }